

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alteration_notifier.h
# Opt level: O2

void __thiscall
lemon::
AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::
attach(AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
       *this,ObserverBase *observer)

{
  iterator iVar1;
  ObserverBase *local_20;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
  local_20 = observer;
  iVar1 = std::__cxx11::
          list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,lemon::SmartDigraphBase::Arc>::ObserverBase*,std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,lemon::SmartDigraphBase::Arc>::ObserverBase*>>
          ::
          emplace<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,lemon::SmartDigraphBase::Arc>::ObserverBase*>
                    ((list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,lemon::SmartDigraphBase::Arc>::ObserverBase*,std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,lemon::SmartDigraphBase::Arc>::ObserverBase*>>
                      *)&this->_observers,
                     (this->_observers).
                     super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>_>
                     ._M_impl._M_node.super__List_node_base._M_next,&local_20);
  (observer->_index)._M_node = iVar1._M_node;
  observer->_notifier = this;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
  return;
}

Assistant:

void attach(ObserverBase& observer) {
    _lock.lock();
    observer._index    = _observers.insert(_observers.begin(), &observer);
    observer._notifier = this;
    _lock.unlock();
  }